

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.cpp
# Opt level: O0

void anon_unknown.dwarf_7f4f::usage(void)

{
  puts("Usage: greg [OPTION]...");
  puts("Options:");
  puts("  --api=API                client API to generate loader for");
  puts("  --core                   use the core profile (OpenGL only)");
  puts("  --version=VERSION        highest API version to generate for");
  puts("  --extensions=EXTENSIONS  list of extensions to generate for");
  puts("  -h, --help               show this help");
  return;
}

Assistant:

void usage()
{
  std::puts("Usage: greg [OPTION]...");
  std::puts("Options:");
  std::puts("  --api=API                client API to generate loader for");
  std::puts("  --core                   use the core profile (OpenGL only)");
  std::puts("  --version=VERSION        highest API version to generate for");
  std::puts("  --extensions=EXTENSIONS  list of extensions to generate for");
  std::puts("  -h, --help               show this help");
}